

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3VdbeSerialGet(uchar *buf,u32 serial_type,Mem *pMem)

{
  MemValue MVar1;
  MemValue MVar2;
  Mem *pMem_local;
  u32 serial_type_local;
  uchar *buf_local;
  
  switch(serial_type) {
  case 0:
  case 0xb:
    pMem->flags = 1;
    goto LAB_0015cc2d;
  case 1:
    pMem->u = (MemValue)(long)(char)*buf;
    pMem->flags = 4;
    buf_local._4_4_ = 1;
    break;
  case 2:
    pMem->u = (MemValue)(long)(int)CONCAT11(*buf,buf[1]);
    pMem->flags = 4;
    buf_local._4_4_ = 2;
    break;
  case 3:
    pMem->u = (MemValue)(long)(int)((int)(char)*buf << 0x10 | (uint)buf[1] << 8 | (uint)buf[2]);
    pMem->flags = 4;
    buf_local._4_4_ = 3;
    break;
  case 4:
    pMem->u = (MemValue)
              (long)(int)((int)(char)*buf << 0x18 | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 |
                         (uint)buf[3]);
    pMem->flags = 4;
    buf_local._4_4_ = 4;
    break;
  case 5:
    MVar1.i._4_4_ = (int)CONCAT11(*buf,buf[1]);
    MVar1.nZero = (uint)buf[2] << 0x18 | (uint)buf[3] << 0x10 | (uint)buf[4] << 8 | (uint)buf[5];
    pMem->u = MVar1;
    pMem->flags = 4;
    buf_local._4_4_ = 6;
    break;
  case 6:
  case 7:
    buf_local._4_4_ = serialGet(buf,serial_type,pMem);
    break;
  case 8:
  case 9:
    MVar2.i._4_4_ = 0;
    MVar2.nZero = serial_type - 8;
    pMem->u = MVar2;
    pMem->flags = 4;
    buf_local._4_4_ = 0;
    break;
  case 10:
    pMem->flags = 0x4001;
    pMem->n = 0;
    (pMem->u).nZero = 0;
LAB_0015cc2d:
    buf_local._4_4_ = 0;
    break;
  default:
    pMem->z = (char *)buf;
    pMem->n = serial_type - 0xc >> 1;
    pMem->flags = sqlite3VdbeSerialGet::aFlag[serial_type & 1];
    buf_local._4_4_ = pMem->n;
  }
  return buf_local._4_4_;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3VdbeSerialGet(
  const unsigned char *buf,     /* Buffer to deserialize from */
  u32 serial_type,              /* Serial type to deserialize */
  Mem *pMem                     /* Memory cell to write value into */
){
  switch( serial_type ){
    case 10: { /* Internal use only: NULL with virtual table
               ** UPDATE no-change flag set */
      pMem->flags = MEM_Null|MEM_Zero;
      pMem->n = 0;
      pMem->u.nZero = 0;
      break;
    }
    case 11:   /* Reserved for future use */
    case 0: {  /* Null */
      /* EVIDENCE-OF: R-24078-09375 Value is a NULL. */
      pMem->flags = MEM_Null;
      break;
    }
    case 1: {
      /* EVIDENCE-OF: R-44885-25196 Value is an 8-bit twos-complement
      ** integer. */
      pMem->u.i = ONE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return 1;
    }
    case 2: { /* 2-byte signed integer */
      /* EVIDENCE-OF: R-49794-35026 Value is a big-endian 16-bit
      ** twos-complement integer. */
      pMem->u.i = TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return 2;
    }
    case 3: { /* 3-byte signed integer */
      /* EVIDENCE-OF: R-37839-54301 Value is a big-endian 24-bit
      ** twos-complement integer. */
      pMem->u.i = THREE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return 3;
    }
    case 4: { /* 4-byte signed integer */
      /* EVIDENCE-OF: R-01849-26079 Value is a big-endian 32-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_INT(buf);
#ifdef __HP_cc 
      /* Work around a sign-extension bug in the HP compiler for HP/UX */
      if( buf[0]&0x80 ) pMem->u.i |= 0xffffffff80000000LL;
#endif
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return 4;
    }
    case 5: { /* 6-byte signed integer */
      /* EVIDENCE-OF: R-50385-09674 Value is a big-endian 48-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_UINT(buf+2) + (((i64)1)<<32)*TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return 6;
    }
    case 6:   /* 8-byte signed integer */
    case 7: { /* IEEE floating point */
      /* These use local variables, so do them in a separate routine
      ** to avoid having to move the frame pointer in the common case */
      return serialGet(buf,serial_type,pMem);
    }
    case 8:    /* Integer 0 */
    case 9: {  /* Integer 1 */
      /* EVIDENCE-OF: R-12976-22893 Value is the integer 0. */
      /* EVIDENCE-OF: R-18143-12121 Value is the integer 1. */
      pMem->u.i = serial_type-8;
      pMem->flags = MEM_Int;
      return 0;
    }
    default: {
      /* EVIDENCE-OF: R-14606-31564 Value is a BLOB that is (N-12)/2 bytes in
      ** length.
      ** EVIDENCE-OF: R-28401-00140 Value is a string in the text encoding and
      ** (N-13)/2 bytes in length. */
      static const u16 aFlag[] = { MEM_Blob|MEM_Ephem, MEM_Str|MEM_Ephem };
      pMem->z = (char *)buf;
      pMem->n = (serial_type-12)/2;
      pMem->flags = aFlag[serial_type&1];
      return pMem->n;
    }
  }
  return 0;
}